

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O1

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::report_race_locked
          (Fasttrack<std::shared_mutex> *this,uint32_t thr1,uint32_t thr2,bool wr1,bool wr2,
          VarState *var,size_t addr)

{
  shared_mutex *__rwlock;
  undefined8 uVar1;
  int iVar2;
  
  __rwlock = &this->g_lock;
  iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
  if (iVar2 != 0x23) {
    report_race(this,thr1,thr2,wr1,wr2,var,addr);
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    return;
  }
  uVar1 = std::__throw_system_error(0x23);
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  _Unwind_Resume(uVar1);
}

Assistant:

void report_race_locked(uint32_t thr1, uint32_t thr2, bool wr1, bool wr2,
                          const VarState& var, size_t addr) {
    std::lock_guard<LockT> lg(g_lock);
    report_race(thr1, thr2, wr1, wr2, var, addr);
  }